

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>::emplaceValue<QEditorInfo>
          (Node<QPersistentModelIndex,_QEditorInfo> *this,QEditorInfo *args)

{
  long in_FS_OFFSET;
  QEditorInfo local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.widget.wp.d = (args->widget).wp.d;
  local_28.widget.wp.value = (args->widget).wp.value;
  (args->widget).wp.d = (Data *)0x0;
  (args->widget).wp.value = (QObject *)0x0;
  local_28.isStatic = args->isStatic;
  QEditorInfo::operator=(&this->value,&local_28);
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }